

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

void __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::add_tag
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this,string *name,tag_type type)

{
  mapped_type *pmVar1;
  c_string cStack_48;
  
  details::c_string::c_string(&cStack_48,name);
  pmVar1 = std::
           map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
           ::operator[](&this->tags,&cStack_48);
  pmVar1->type = type;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_48.container_._M_dataplus._M_p != &cStack_48.container_.field_2) {
    operator_delete(cStack_48.container_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void add_tag(std::string const &name,rules::tag_type type)
		{
			tags[c_string(name)].type=type;
		}